

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall CMeshClosestPointMapper::SeamTool::Process(SeamTool *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Data *pDVar5;
  ON_MeshTopology *pOVar6;
  ON_MeshTopologyFace *this_00;
  ON_MeshTopologyEdge *te_00;
  double *pdVar7;
  double *pdVar8;
  int local_1e4;
  int local_19c;
  undefined1 local_198 [4];
  int j;
  ON_3dPoint local_180;
  ON_BoundingBox local_168;
  undefined1 local_138 [8];
  ON_Line seamLine_1;
  ON_3dPoint local_f0;
  ON_BoundingBox local_d8;
  undefined1 local_a8 [8];
  ON_Line seamLine;
  int ofi;
  ON_MeshTopologyEdge *te;
  int i;
  int fec;
  ON_MeshTopologyFace *tf;
  undefined1 local_48 [8];
  ON_SimpleArray<int> seamlessFis;
  ON_SimpleArray<int> seamedFis;
  int fi;
  SeamTool *this_local;
  
  this->m_bHasSeams = false;
  iVar3 = ON_Mesh::FaceCount(this->m_mesh);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pDVar5 = (Data *)operator_new__(uVar4);
  this->m_faceData = pDVar5;
  for (seamedFis.m_capacity = 0; iVar3 = ON_Mesh::FaceCount(this->m_mesh),
      seamedFis.m_capacity < iVar3; seamedFis.m_capacity = seamedFis.m_capacity + 1) {
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&seamlessFis.m_count,4);
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_48,4);
    pOVar6 = ON_Mesh::Topology(this->m_mesh);
    this_00 = ON_SimpleArray<ON_MeshTopologyFace>::operator[](&pOVar6->m_topf,seamedFis.m_capacity);
    bVar2 = ON_MeshTopologyFace::IsTriangle(this_00);
    iVar3 = 4;
    if (bVar2) {
      iVar3 = 3;
    }
    for (te._0_4_ = 0; (int)te < iVar3; te._0_4_ = (int)te + 1) {
      pOVar6 = ON_Mesh::Topology(this->m_mesh);
      te_00 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                        (&pOVar6->m_tope,this_00->m_topei[(int)te]);
      if (te_00->m_topf_count == 2) {
        if (*te_00->m_topfi == seamedFis.m_capacity) {
          local_1e4 = te_00->m_topfi[1];
        }
        else {
          local_1e4 = *te_00->m_topfi;
        }
        seamLine.to.z._4_4_ = local_1e4;
        bVar2 = TcContinuous(this->m_mesh,this->m_tc,te_00);
        if (bVar2) {
          ON_SimpleArray<int>::Append
                    ((ON_SimpleArray<int> *)local_48,(int *)((long)&seamLine.to.z + 4));
        }
        else {
          ON_SimpleArray<int>::Append
                    ((ON_SimpleArray<int> *)&seamlessFis.m_count,(int *)((long)&seamLine.to.z + 4));
          pOVar6 = ON_Mesh::Topology(this->m_mesh);
          ON_MeshTopology::TopEdgeLine((ON_Line *)local_a8,pOVar6,this_00->m_topei[(int)te]);
          ON_Line::BoundingBox(&local_d8,(ON_Line *)local_a8);
          pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_d8.m_min);
          ON_Line::BoundingBox((ON_BoundingBox *)&seamLine_1.to.z,(ON_Line *)local_a8);
          pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_f0);
          ON_RTree::Insert(&this->m_seamTree,pdVar7,pdVar8,this_00->m_topei[(int)te]);
          this->m_bHasSeams = true;
          ON_Line::~ON_Line((ON_Line *)local_a8);
        }
      }
      else if (2 < te_00->m_topf_count) {
        pOVar6 = ON_Mesh::Topology(this->m_mesh);
        ON_MeshTopology::TopEdgeLine((ON_Line *)local_138,pOVar6,this_00->m_topei[(int)te]);
        ON_Line::BoundingBox(&local_168,(ON_Line *)local_138);
        pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_168.m_min);
        ON_Line::BoundingBox((ON_BoundingBox *)local_198,(ON_Line *)local_138);
        pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_180);
        ON_RTree::Insert(&this->m_seamTree,pdVar7,pdVar8,this_00->m_topei[(int)te]);
        for (local_19c = 0; local_19c < te_00->m_topf_count; local_19c = local_19c + 1) {
          if (te_00->m_topfi[local_19c] != seamedFis.m_capacity) {
            ON_SimpleArray<int>::Append
                      ((ON_SimpleArray<int> *)&seamlessFis.m_count,te_00->m_topfi + local_19c);
            this->m_bHasSeams = true;
          }
        }
        ON_Line::~ON_Line((ON_Line *)local_138);
      }
    }
    Data::Set(this->m_faceData + seamedFis.m_capacity,(ON_SimpleArray<int> *)local_48,
              (ON_SimpleArray<int> *)&seamlessFis.m_count);
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_48);
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&seamlessFis.m_count);
  }
  this->m_bProcessed = true;
  return;
}

Assistant:

void Process() const
    {
      m_bHasSeams = false;
      m_faceData = new Data[m_mesh.FaceCount()];
      for (int fi = 0; fi < m_mesh.FaceCount(); fi++)
      {
        ON_SimpleArray<int> seamedFis(4);
        ON_SimpleArray<int> seamlessFis(4);
        const ON_MeshTopologyFace& tf = m_mesh.Topology().m_topf[fi];
        const int fec = tf.IsTriangle() ? 3 : 4;
        for (int i = 0; i < fec; i++)
        {
          const ON_MeshTopologyEdge& te = m_mesh.Topology().m_tope[tf.m_topei[i]];
          if (te.m_topf_count == 2)
          {
            const int ofi = te.m_topfi[0] == fi ? te.m_topfi[1] : te.m_topfi[0];
            if (TcContinuous(m_mesh, m_tc, te))
            {
              seamlessFis.Append(ofi);
            }
            else
            {
              seamedFis.Append(ofi);
              const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
              m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
              m_bHasSeams = true;
            }
          }
          else if (te.m_topf_count > 2)
          {
            const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
            m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
            for (int j = 0; j < te.m_topf_count; j++)
            {
              if (te.m_topfi[j] != fi)
              {
                seamedFis.Append(te.m_topfi[j]);
                m_bHasSeams = true;
              }
            }
          }
        }
        m_faceData[fi].Set(seamlessFis, seamedFis);
      }
      m_bProcessed = true;
    }